

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pline.c
# Opt level: O0

void You_hear(char *line,...)

{
  char in_AL;
  size_t sVar1;
  char *line_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  char *local_30;
  char *tmp;
  va_list the_args;
  char *line_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  the_args[0].overflow_arg_area = local_e8;
  the_args[0]._0_8_ = &stack0x00000008;
  tmp._4_4_ = 0x30;
  tmp._0_4_ = 8;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  the_args[0].reg_save_area = line;
  if (((byte)u._1052_1_ >> 1 & 1) == 0) {
    if (u.usleep == 0) {
      sVar1 = strlen(line);
      local_30 = You_buf((int)sVar1 + 10);
      strcpy(local_30,"You hear ");
    }
    else {
      sVar1 = strlen(line);
      local_30 = You_buf((int)sVar1 + 0x19);
      strcpy(local_30,"You dream that you hear ");
    }
  }
  else {
    sVar1 = strlen(line);
    local_30 = You_buf((int)sVar1 + 0x11);
    strcpy(local_30,"You barely hear ");
  }
  line_00 = strcat(local_30,(char *)the_args[0].reg_save_area);
  vpline(line_00,(__va_list_tag *)&tmp);
  return;
}

Assistant:

void You_hear (const char *line, ...)
{
	va_list the_args;
	char *tmp;
	va_start(the_args, line);
	if (Underwater)
		YouPrefix(tmp, "You barely hear ", line);
	else if (u.usleep)
		YouPrefix(tmp, "You dream that you hear ", line);
	else
		YouPrefix(tmp, "You hear ", line);
	vpline(strcat(tmp, line), the_args);
	va_end(the_args);
}